

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2TextureSharingTest::renderResource
          (GLES2TextureSharingTest *this,Surface *screen,Surface *reference)

{
  glReadPixelsFunc p_Var1;
  uint uVar2;
  GLenum GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLint GVar6;
  TestError *pTVar7;
  uint uVar8;
  GLsizei GVar9;
  long lVar10;
  int iVar11;
  void *data;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  uint uVar22;
  Vec4 color;
  ProgramSources sources;
  ShaderProgram program;
  undefined1 local_228 [40];
  Surface *local_200;
  value_type local_1f8;
  ProgramSources local_1d8;
  ShaderProgram local_100;
  
  local_228._0_8_ = (long)local_228 + 0x10;
  local_200 = reference;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,
             "attribute mediump vec2 a_pos;\nattribute mediump vec2 a_texCorod;\nvarying mediump vec2 v_texCoord;\nvoid main(void)\n{\n\tv_texCoord = a_texCorod;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
             ,"");
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "varying mediump vec2 v_texCoord;\nuniform sampler2D u_sampler;\nvoid main(void)\n{\n\tgl_FragColor = texture2D(u_sampler, v_texCoord);\n}\n"
             ,"");
  memset(&local_1d8,0,0xac);
  local_1d8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._0_9_ = SUB169((undefined1  [16])0x0,0);
  local_1d8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_1d8._192_9_ = SUB169((undefined1  [16])0x0,7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1d8.sources,(value_type *)local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1d8.sources + 1,&local_1f8);
  glu::ShaderProgram::ShaderProgram(&local_100,&(this->super_GLES2SharingTest).m_gl,&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1d8.attribLocationBindings);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_1d8.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_228._0_8_ != (long)local_228 + 0x10) {
    operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
  }
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x219);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (screen == (Surface *)0x0) {
    iVar12 = 0xf0;
    GVar9 = 0xf0;
  }
  else {
    GVar9 = screen->m_width;
    iVar12 = screen->m_height;
  }
  (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,GVar9,iVar12);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"viewport(0, 0, width, height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x237);
  (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x239);
  (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"clear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x23a);
  (*(this->super_GLES2SharingTest).m_gl.useProgram)(local_100.m_program.m_program);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x23c);
  GVar4 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                    (local_100.m_program.m_program,"a_pos");
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x23f);
  if (GVar4 == 0xffffffff) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,(char *)0x0,"coordLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x240);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                    (local_100.m_program.m_program,"a_texCorod");
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x243);
  if (GVar5 == 0xffffffff) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,(char *)0x0,"texCoordLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x244);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  GVar6 = (*(this->super_GLES2SharingTest).m_gl.getUniformLocation)
                    (local_100.m_program.m_program,"u_sampler");
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar3,"glGetUniformLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x248);
  if (GVar6 != -1) {
    (*(this->super_GLES2SharingTest).m_gl.activeTexture)(0x84c0);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"activeTexture(GL_TEXTURE0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x24b);
    (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,this->m_glTexture);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"bindTexture(GL_TEXTURE_2D, m_glTexture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x24c);
    (*(this->super_GLES2SharingTest).m_gl.uniform1i)(GVar6,0);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"uniform1i(samplerLocation, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x24e);
    (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar5);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"enableVertexAttribArray(texCoordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x250);
    (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar4);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"enableVertexAttribArray(coordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x251);
    (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
              (GVar5,2,0x1406,'\0',0,renderResource::texCoords);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,
                    "vertexAttribPointer(texCoordLocation, 2, GL_FLOAT, GL_FALSE, 0, texCoords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x253);
    (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
              (GVar4,2,0x1406,'\0',0,renderResource::coords);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x254);
    (*(this->super_GLES2SharingTest).m_gl.drawElements)(4,6,0x1403,renderResource::indices);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x256);
    (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar4);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"disableVertexAttribArray(coordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,599);
    (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar5);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"disableVertexAttribArray(texCoordLocation)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,600);
    (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,0);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x25a);
    (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
    GVar3 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar3,"useProgram(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x25b);
    if (screen != (Surface *)0x0) {
      p_Var1 = (this->super_GLES2SharingTest).m_gl.readPixels;
      iVar11 = screen->m_width;
      iVar13 = screen->m_height;
      local_228._0_4_ = RGBA;
      local_228._4_4_ = UNORM_INT8;
      data = (void *)(screen->m_pixels).m_cap;
      if (data != (void *)0x0) {
        data = (screen->m_pixels).m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_1d8,(TextureFormat *)local_228,iVar11,iVar13,1,data);
      (*p_Var1)(0,0,iVar11,iVar13,0x1908,0x1401,
                (void *)CONCAT44(local_1d8.sources[1].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 local_1d8.sources[1].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_4_));
      if (0 < GVar9) {
        iVar11 = 0;
        do {
          if (0 < iVar12) {
            iVar13 = 0;
            do {
              local_1d8.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000002;
              local_1d8.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x100000002;
              local_1d8.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000001;
              local_1d8.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
              local_1d8.sources[2].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
              local_1d8.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
              local_1d8.sources._45_8_ = 0;
              local_1d8.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
              local_1d8.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
              local_1d8.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
              local_1d8.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              tcu::sampleLevelArray2D
                        ((ConstPixelBufferAccess *)local_228,(int)(this->m_texture).m_view.m_levels,
                         (Sampler *)(ulong)(uint)(this->m_texture).m_view.m_numLevels,
                         (float)iVar11 / ((float)GVar9 + -1.0),
                         (float)iVar13 / ((float)iVar12 + -1.0),(int)&local_1d8,0.0);
              uVar14 = (uint)((float)local_228._0_4_ * 255.0);
              uVar17 = (uint)((float)local_228._4_4_ * 255.0);
              uVar18 = (uint)((float)local_228._8_4_ * 255.0);
              uVar19 = (uint)((float)local_228._12_4_ * 255.0);
              uVar2 = uVar14;
              if (0xfe < uVar14) {
                uVar2 = 0xff;
              }
              uVar8 = uVar17;
              if (0xfe < uVar17) {
                uVar8 = 0xff;
              }
              uVar21 = -(uint)(-0x7fffff02 < (int)(uVar18 ^ 0x80000000));
              uVar22 = -(uint)(-0x7fffff02 < (int)(uVar19 ^ 0x80000000));
              auVar16._12_4_ = (uVar22 >> 0x18 | ~uVar22 & uVar19) << 0x18;
              auVar16._8_4_ = (uVar21 >> 0x18 | ~uVar21 & uVar18) << 0x10;
              auVar16._4_4_ = uVar8 << 8;
              auVar16._0_4_ = uVar2;
              auVar15._0_4_ = (int)uVar14 >> 0x1f;
              auVar15._4_4_ = (int)uVar17 >> 0x1f;
              auVar15._8_4_ = (int)uVar18 >> 0x1f;
              auVar15._12_4_ = (int)uVar19 >> 0x1f;
              auVar16 = ~auVar15 & auVar16;
              auVar20._0_8_ = auVar16._8_8_;
              auVar20._8_4_ = auVar16._8_4_;
              auVar20._12_4_ = auVar16._12_4_;
              *(uint *)((long)(local_200->m_pixels).m_ptr +
                       (long)(local_200->m_width * iVar13 + iVar11) * 4) =
                   SUB164(auVar20 | auVar16,4) | SUB164(auVar20 | auVar16,0);
              iVar13 = iVar13 + 1;
            } while (iVar12 != iVar13);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != GVar9);
      }
    }
    glu::ShaderProgram::~ShaderProgram(&local_100);
    return;
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,(char *)0x0,"samplerLocation != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x249);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2TextureSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump vec2 a_texCorod;\n"
	"varying mediump vec2 v_texCoord;\n"
	"void main(void)\n"
	"{\n"
	"\tv_texCoord = a_texCorod;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump vec2 v_texCoord;\n"
	"uniform sampler2D u_sampler;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = texture2D(u_sampler, v_texCoord);\n"
	"}\n";

	glu::ShaderProgram program(m_gl, glu::makeVtxFragSources(vertexShader, fragmentShader));

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-1.0f, -1.0f,
		 1.0f, -1.0f,
		 1.0f,  1.0f,
		-1.0f,  1.0f
	};

	static const GLfloat texCoords[] = {
		0.0f, 0.0f,
		1.0f, 0.0f,
		1.0f, 1.0f,
		0.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	GLuint coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint texCoordLocation = m_gl.getAttribLocation(program.getProgram(), "a_texCorod");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(texCoordLocation != (GLuint)-1);


	GLuint samplerLocation = m_gl.getUniformLocation(program.getProgram(), "u_sampler");
	GLU_CHECK_GLW_MSG(m_gl, "glGetUniformLocation()");
	TCU_CHECK(samplerLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, activeTexture(GL_TEXTURE0));
	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, m_glTexture));

	GLU_CHECK_GLW_CALL(m_gl, uniform1i(samplerLocation, 0));

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(texCoordLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(texCoordLocation, 2, GL_FLOAT, GL_FALSE, 0, texCoords));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(texCoordLocation));

	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, 0));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		for (int x = 0; x < width; x++)
		{
			for (int y = 0; y < height; y++)
			{
				float t = ((float)x / ((float)width - 1.0f));
				float s = ((float)y / ((float)height - 1.0f));
				float lod = 0.0f;

				tcu::Vec4 color = m_texture.sample(tcu::Sampler(tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::LINEAR, tcu::Sampler::LINEAR), t, s, lod);

				int r = deClamp32((int)(255.0f * color.x()), 0, 255);
				int g = deClamp32((int)(255.0f * color.y()), 0, 255);
				int b = deClamp32((int)(255.0f * color.z()), 0, 255);
				int a = deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(r, g, b, a));
			}
		}
	}
}